

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void __thiscall
LinearNE<0,_1,_1>::LinearNE
          (LinearNE<0,_1,_1> *this,vec<int> *a,vec<IntVar_*> *_x,int _c,BoolView *_r)

{
  uint uVar1;
  long *plVar2;
  ulong uVar3;
  uint i;
  ulong uVar4;
  long lVar5;
  int i_2;
  IntView<0> local_58;
  vec<IntView<0>_> local_48;
  BoolView *local_38;
  
  Propagator::Propagator(&this->super_Propagator);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__LinearNE_001f2428;
  uVar1 = _x->sz;
  this->sz = uVar1;
  this->c = _c;
  local_38 = &this->r;
  (this->r).super_Var.super_Branching._vptr_Branching = (_func_int **)&PTR_finished_001efbb8;
  (this->r).v = _r->v;
  (this->r).s = _r->s;
  (this->num_unfixed).v = uVar1;
  (this->sum_fixed).v = (long)-_c;
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (IntView<0> *)0x0;
  for (uVar4 = 0; uVar3 = (ulong)a->sz, uVar4 < uVar3; uVar4 = uVar4 + 1) {
    if (-1 < a->data[uVar4]) {
      local_58.var = _x->data[uVar4];
      local_58.b = 0;
      local_58.a = a->data[uVar4];
      vec<IntView<0>_>::push(&local_48,&local_58);
    }
  }
  *(uint *)&(this->super_Propagator).field_0x14 = local_48.sz;
  for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
    if (a->data[uVar4] < 0) {
      local_58.var = _x->data[uVar4];
      local_58.a = -a->data[uVar4];
      local_58.b = 0;
      vec<IntView<0>_>::push(&local_48,&local_58);
      uVar3 = (ulong)a->sz;
    }
  }
  this->x = local_48.data;
  this->y = (IntView<1> *)local_48.data;
  local_48.sz = 0;
  local_48.cap = 0;
  local_48.data = (IntView<0> *)0x0;
  lVar5 = 0;
  for (uVar4 = 0; (long)uVar4 < (long)this->sz; uVar4 = uVar4 + 1) {
    plVar2 = *(long **)((long)&this->x->var + lVar5);
    (**(code **)(*plVar2 + 0x38))(plVar2,this,uVar4 & 0xffffffff,8);
    lVar5 = lVar5 + 0x10;
  }
  BoolView::attach(local_38,&this->super_Propagator,this->sz,2);
  free(local_48.data);
  return;
}

Assistant:

LinearNE(vec<int>& a, vec<IntVar*>& _x, int _c, BoolView _r = bv_true)
			: sz(_x.size()), c(_c), r(std::move(_r)), num_unfixed(sz), sum_fixed(-c) {
		vec<IntView<0> > w;
		for (unsigned int i = 0; i < a.size(); i++) {
			if (a[i] >= 0) {
				w.push(IntView<0>(_x[i], a[i]));
			}
		}
		sp = w.size();
		for (unsigned int i = 0; i < a.size(); i++) {
			if (a[i] < 0) {
				w.push(IntView<0>(_x[i], -a[i]));
			}
		}
		x = (IntView<U>*)(IntView<0>*)w;
		y = (IntView<V>*)(IntView<0>*)w;
		w.release();

		for (int i = 0; i < sz; i++) {
			x[i].attach(this, i, EVENT_F);
		}
		if (R != 0) {
			r.attach(this, sz, EVENT_L);
		}
		//		printf("LinearNE: %d %d %d %d %d\n", sp, sz, U, V, R);
	}